

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

void uv__io_stop(uv_loop_t *loop,uv__io_t *w,uint events)

{
  int iVar1;
  uint events_local;
  uv__io_t *w_local;
  uv_loop_t *loop_local;
  
  if ((events & 0xffffdff8) != 0) {
    __assert_fail("0 == (events & ~(POLLIN | POLLOUT | UV__POLLRDHUP | UV__POLLPRI))",
                  "/workspace/llm4binary/github/license_c_cmakelists/mattn[P]http-server/deps/libuv/src/unix/core.c"
                  ,0x3a6,"void uv__io_stop(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  if (events == 0) {
    __assert_fail("0 != events",
                  "/workspace/llm4binary/github/license_c_cmakelists/mattn[P]http-server/deps/libuv/src/unix/core.c"
                  ,0x3a7,"void uv__io_stop(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  if (w->fd != -1) {
    if (w->fd < 0) {
      __assert_fail("w->fd >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/mattn[P]http-server/deps/libuv/src/unix/core.c"
                    ,0x3ac,"void uv__io_stop(uv_loop_t *, uv__io_t *, unsigned int)");
    }
    if ((uint)w->fd < loop->nwatchers) {
      w->pevents = (events ^ 0xffffffff) & w->pevents;
      if (w->pevents == 0) {
        uv__queue_remove(&w->watcher_queue);
        uv__queue_init(&w->watcher_queue);
        w->events = 0;
        if (w == loop->watchers[w->fd]) {
          if (loop->nfds == 0) {
            __assert_fail("loop->nfds > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/mattn[P]http-server/deps/libuv/src/unix/core.c"
                          ,0x3ba,"void uv__io_stop(uv_loop_t *, uv__io_t *, unsigned int)");
          }
          loop->watchers[w->fd] = (uv__io_t *)0x0;
          loop->nfds = loop->nfds - 1;
        }
      }
      else {
        iVar1 = uv__queue_empty(&w->watcher_queue);
        if (iVar1 != 0) {
          uv__queue_insert_tail(&loop->watcher_queue,&w->watcher_queue);
        }
      }
    }
  }
  return;
}

Assistant:

void uv__io_stop(uv_loop_t* loop, uv__io_t* w, unsigned int events) {
  assert(0 == (events & ~(POLLIN | POLLOUT | UV__POLLRDHUP | UV__POLLPRI)));
  assert(0 != events);

  if (w->fd == -1)
    return;

  assert(w->fd >= 0);

  /* Happens when uv__io_stop() is called on a handle that was never started. */
  if ((unsigned) w->fd >= loop->nwatchers)
    return;

  w->pevents &= ~events;

  if (w->pevents == 0) {
    uv__queue_remove(&w->watcher_queue);
    uv__queue_init(&w->watcher_queue);
    w->events = 0;

    if (w == loop->watchers[w->fd]) {
      assert(loop->nfds > 0);
      loop->watchers[w->fd] = NULL;
      loop->nfds--;
    }
  }
  else if (uv__queue_empty(&w->watcher_queue))
    uv__queue_insert_tail(&loop->watcher_queue, &w->watcher_queue);
}